

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O0

void __thiscall sfc::Image::Image(Image *this,Image *image,Subpalette *subpalette)

{
  value_type vVar1;
  bool bVar2;
  uint uVar3;
  rgba_t rVar4;
  Mode MVar5;
  reference pvVar6;
  ulong uVar7;
  size_type sVar8;
  reference pvVar9;
  runtime_error *prVar10;
  iterator __first;
  iterator __last;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> local_b0;
  undefined1 local_80 [8];
  rgba_vec_t rgba_v;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_60;
  uint *local_58;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_50;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_48;
  ulong local_40;
  size_t palette_index;
  rgba_t color;
  uint i;
  uint size;
  Subpalette *local_20;
  Subpalette *subpalette_local;
  Image *image_local;
  Image *this_local;
  
  local_20 = subpalette;
  subpalette_local = (Subpalette *)image;
  image_local = this;
  uVar3 = width(image);
  this->_width = uVar3;
  uVar3 = height((Image *)subpalette_local);
  this->_height = uVar3;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->_data);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->_indexed_data);
  Subpalette::normalized_colors(&this->_palette,local_20);
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            (&this->_colors);
  bVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty(&this->_palette);
  if (bVar2) {
    prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar10,"No colors");
    __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  color = this->_width * this->_height;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->_indexed_data,(ulong)color);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->_data,(ulong)(color << 2));
  palette_index._4_4_ = 0;
  do {
    if (color <= palette_index._4_4_) {
      this->_src_coord_y = 0;
      this->_src_coord_x = 0;
      rgba_data((rgba_vec_t *)local_80,this);
      __first = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_80);
      __last = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_80);
      std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>::
      set<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                ((set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>> *)&local_b0
                 ,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                   )__first._M_current,
                 (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  )__last._M_current);
      std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::operator=
                (&this->_colors,&local_b0);
      std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
                (&local_b0);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_80);
      return;
    }
    rVar4 = rgba_color_at((Image *)subpalette_local,palette_index._4_4_);
    MVar5 = Subpalette::mode(local_20);
    rVar4 = reduce_color(rVar4,MVar5);
    MVar5 = Subpalette::mode(local_20);
    palette_index._0_4_ = normalize_color(rVar4,MVar5);
    if ((rgba_t)palette_index == 0) {
      pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&this->_indexed_data,(ulong)palette_index._4_4_);
      *pvVar6 = '\0';
      set_pixel(this,0,palette_index._4_4_);
    }
    else {
      local_50._M_current =
           (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(&this->_palette);
      local_58 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                   (&this->_palette);
      local_48 = std::
                 find<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_int>
                           (local_50,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                      )local_58,(uint *)&palette_index);
      local_60._M_current =
           (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(&this->_palette);
      uVar7 = __gnu_cxx::operator-(&local_48,&local_60);
      local_40 = uVar7;
      sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->_palette);
      if (sVar8 <= uVar7) {
        prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar10,"Color not in palette");
        __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      vVar1 = (value_type)local_40;
      pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&this->_indexed_data,(ulong)palette_index._4_4_);
      *pvVar6 = vVar1;
      pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->_palette,local_40);
      rgba_color::rgba_color
                ((rgba_color *)
                 ((long)&rgba_v.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 4),*pvVar9);
      rVar4 = rgba_color::operator_cast_to_unsigned_int
                        ((rgba_color *)
                         ((long)&rgba_v.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
      set_pixel(this,rVar4,palette_index._4_4_);
    }
    palette_index._4_4_ = palette_index._4_4_ + 1;
  } while( true );
}

Assistant:

Image::Image(const Image& image, const sfc::Subpalette& subpalette)
    : _width(image.width()), _height(image.height()), _palette(subpalette.normalized_colors()) {
  if (_palette.empty())
    throw std::runtime_error("No colors");

  unsigned size = _width * _height;
  _indexed_data.resize(size);
  _data.resize(size * 4);

  for (unsigned i = 0; i < size; ++i) {
    rgba_t color = sfc::normalize_color(sfc::reduce_color(image.rgba_color_at(i), subpalette.mode()), subpalette.mode());
    if (color == transparent_color) {
      _indexed_data[i] = 0;
      set_pixel(transparent_color, i);
    } else {
      size_t palette_index = std::find(_palette.begin(), _palette.end(), color) - _palette.begin();
      if (palette_index < _palette.size()) {
        _indexed_data[i] = (index_t)palette_index;
        set_pixel(sfc::rgba_color(_palette[palette_index]), i);
      } else {
        throw std::runtime_error("Color not in palette");
      }
    }
  }

  _src_coord_x = _src_coord_y = 0;

  auto rgba_v = rgba_data();
  _colors = rgba_set_t(rgba_v.begin(), rgba_v.end());
}